

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEsop.c
# Opt level: O3

void Eso_ManStop(Eso_Man_t *p)

{
  Vec_Wec_t *pVVar1;
  void *pvVar2;
  Hsh_VecMan_t *__ptr;
  int *piVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  long lVar6;
  long lVar7;
  
  pVVar1 = p->vEsops;
  iVar4 = pVVar1->nCap;
  pVVar5 = pVVar1->pArray;
  if (iVar4 < 1) {
    if (pVVar5 != (Vec_Int_t *)0x0) goto LAB_00738a41;
  }
  else {
    lVar7 = 8;
    lVar6 = 0;
    do {
      pvVar2 = *(void **)((long)&pVVar5->nCap + lVar7);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        pVVar5 = pVVar1->pArray;
        *(undefined8 *)((long)&pVVar5->nCap + lVar7) = 0;
        iVar4 = pVVar1->nCap;
      }
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 0x10;
    } while (lVar6 < iVar4);
LAB_00738a41:
    free(pVVar5);
  }
  free(pVVar1);
  __ptr = p->pHash;
  pVVar5 = __ptr->vTable;
  piVar3 = pVVar5->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar5);
  pVVar5 = __ptr->vData;
  piVar3 = pVVar5->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar5);
  pVVar5 = __ptr->vMap;
  piVar3 = pVVar5->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar5);
  free(__ptr);
  pVVar1 = p->vCubes;
  iVar4 = pVVar1->nCap;
  pVVar5 = pVVar1->pArray;
  if (iVar4 < 1) {
    if (pVVar5 == (Vec_Int_t *)0x0) goto LAB_00738afa;
  }
  else {
    lVar7 = 8;
    lVar6 = 0;
    do {
      pvVar2 = *(void **)((long)&pVVar5->nCap + lVar7);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        pVVar5 = pVVar1->pArray;
        *(undefined8 *)((long)&pVVar5->nCap + lVar7) = 0;
        iVar4 = pVVar1->nCap;
      }
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 0x10;
    } while (lVar6 < iVar4);
  }
  free(pVVar5);
LAB_00738afa:
  free(pVVar1);
  pVVar5 = p->vCube1;
  piVar3 = pVVar5->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar5);
  pVVar5 = p->vCube2;
  piVar3 = pVVar5->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar5);
  pVVar5 = p->vCube;
  piVar3 = pVVar5->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar5);
  free(p);
  return;
}

Assistant:

void Eso_ManStop( Eso_Man_t * p )
{
    Vec_WecFree( p->vEsops );
    Hsh_VecManStop( p->pHash );
    Vec_WecFree( p->vCubes );
    Vec_IntFree( p->vCube1 );
    Vec_IntFree( p->vCube2 );
    Vec_IntFree( p->vCube );
    ABC_FREE( p );
}